

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_update_servers.c
# Opt level: O3

ares_status_t set_servers_csv(ares_channel_t *channel,char *_csv)

{
  ares_status_t aVar1;
  size_t sVar2;
  ares_llist_t *slist;
  ares_llist_t *local_20;
  
  local_20 = (ares_llist_t *)0x0;
  if (channel == (ares_channel_t *)0x0) {
    aVar1 = ARES_ENODATA;
  }
  else {
    sVar2 = ares_strlen(_csv);
    if (sVar2 == 0) {
      ares_channel_lock(channel);
      aVar1 = ares_servers_update(channel,(ares_llist_t *)0x0,ARES_TRUE);
      ares_channel_unlock(channel);
    }
    else {
      aVar1 = ares_sconfig_append_fromstr(channel,&local_20,_csv,ARES_FALSE);
      if (aVar1 == ARES_SUCCESS) {
        ares_channel_lock(channel);
        aVar1 = ares_servers_update(channel,local_20,ARES_TRUE);
        ares_channel_unlock(channel);
      }
      ares_llist_destroy(local_20);
    }
  }
  return aVar1;
}

Assistant:

static ares_status_t set_servers_csv(ares_channel_t *channel, const char *_csv)
{
  ares_status_t status;
  ares_llist_t *slist = NULL;

  if (channel == NULL) {
    return ARES_ENODATA;
  }

  if (ares_strlen(_csv) == 0) {
    /* blank all servers */
    ares_channel_lock(channel);
    status = ares_servers_update(channel, NULL, ARES_TRUE);
    ares_channel_unlock(channel);
    return status;
  }

  status = ares_sconfig_append_fromstr(channel, &slist, _csv, ARES_FALSE);
  if (status != ARES_SUCCESS) {
    ares_llist_destroy(slist);
    return status;
  }

  ares_channel_lock(channel);
  status = ares_servers_update(channel, slist, ARES_TRUE);
  ares_channel_unlock(channel);

  ares_llist_destroy(slist);

  return status;
}